

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O3

natwm_error button_handle_focus(natwm_state *state,workspace *workspace,client *client)

{
  natwm_error nVar1;
  
  nVar1 = workspace_focus_client(state,workspace,client);
  if (nVar1 == NO_ERROR) {
    xcb_allow_events(state->xcb,2,0);
  }
  return nVar1;
}

Assistant:

enum natwm_error button_handle_focus(struct natwm_state *state, struct workspace *workspace,
                                     struct client *client)
{
        enum natwm_error err = workspace_focus_client(state, workspace, client);

        if (err != NO_ERROR) {
                return err;
        }

        // For the focus event we queue the event, and once we have
        // focused both the workspace (if needed) and the client we
        // release the queued event and the client receives the event
        // like normal
        xcb_allow_events(state->xcb, XCB_ALLOW_REPLAY_POINTER, XCB_CURRENT_TIME);

        return NO_ERROR;
}